

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O3

ostream * testing::operator<<(ostream *os,TestPartResult *result)

{
  Type TVar1;
  ostream *poVar2;
  size_t sVar3;
  int in_ECX;
  internal *this;
  char *pcVar4;
  string local_38;
  
  this = (internal *)(result->file_name_)._M_string_length;
  if (this != (internal *)0x0) {
    this = (internal *)(result->file_name_)._M_dataplus._M_p;
  }
  internal::FormatFileLocation_abi_cxx11_
            (&local_38,this,(char *)(ulong)(uint)result->line_number_,in_ECX);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  TVar1 = result->type_;
  if (TVar1 == kSuccess) {
    pcVar4 = "Success";
  }
  else if (TVar1 == kSkip) {
    pcVar4 = "Skipped";
  }
  else {
    pcVar4 = "Non-fatal failure";
    if (TVar1 == kFatalFailure) {
      pcVar4 = "Fatal failure";
    }
  }
  sVar3 = strlen(pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":\n",2);
  pcVar4 = (result->message_)._M_dataplus._M_p;
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TestPartResult& result) {
  return os << internal::FormatFileLocation(result.file_name(),
                                            result.line_number())
            << " "
            << (result.type() == TestPartResult::kSuccess ? "Success"
                : result.type() == TestPartResult::kSkip  ? "Skipped"
                : result.type() == TestPartResult::kFatalFailure
                    ? "Fatal failure"
                    : "Non-fatal failure")
            << ":\n"
            << result.message() << std::endl;
}